

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

i64 journalHdrOffset(Pager *pPager)

{
  i64 c;
  i64 offset;
  Pager *pPager_local;
  
  c = 0;
  if (pPager->journalOff != 0) {
    c = ((pPager->journalOff + -1) / (long)(ulong)pPager->sectorSize + 1) *
        (ulong)pPager->sectorSize;
  }
  return c;
}

Assistant:

static i64 journalHdrOffset(Pager *pPager){
  i64 offset = 0;
  i64 c = pPager->journalOff;
  if( c ){
    offset = ((c-1)/JOURNAL_HDR_SZ(pPager) + 1) * JOURNAL_HDR_SZ(pPager);
  }
  assert( offset%JOURNAL_HDR_SZ(pPager)==0 );
  assert( offset>=c );
  assert( (offset-c)<JOURNAL_HDR_SZ(pPager) );
  return offset;
}